

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglprogrambinarycache.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_175eb32::GLEnvInfo::GLEnvInfo(GLEnvInfo *this)

{
  GLubyte *pGVar1;
  GLubyte *pGVar2;
  QByteArray *this_00;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  char *version;
  char *renderer;
  char *vendor;
  QOpenGLFunctions *f;
  QOpenGLContext *ctx;
  QOpenGLContext *in_stack_ffffffffffffff80;
  QByteArray local_50;
  QByteArray local_38;
  QByteArray local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QByteArray::QByteArray((QByteArray *)0x91147b);
  QByteArray::QByteArray((QByteArray *)0x911488);
  QByteArray::QByteArray((QByteArray *)0x911495);
  QOpenGLContext::currentContext();
  QOpenGLContext::functions(in_stack_ffffffffffffff80);
  pGVar1 = QOpenGLFunctions::glGetString
                     ((QOpenGLFunctions *)in_stack_ffffffffffffff80,(GLenum)((ulong)in_RDI >> 0x20))
  ;
  pGVar2 = QOpenGLFunctions::glGetString
                     ((QOpenGLFunctions *)in_stack_ffffffffffffff80,(GLenum)((ulong)in_RDI >> 0x20))
  ;
  this_00 = (QByteArray *)
            QOpenGLFunctions::glGetString
                      ((QOpenGLFunctions *)in_stack_ffffffffffffff80,(GLenum)((ulong)in_RDI >> 0x20)
                      );
  if (pGVar1 != (GLubyte *)0x0) {
    QByteArray::QByteArray(&local_20,(char *)pGVar1,-1);
    QByteArray::operator=(this_00,in_RDI);
    QByteArray::~QByteArray((QByteArray *)0x911520);
  }
  if (pGVar2 != (GLubyte *)0x0) {
    QByteArray::QByteArray(&local_38,(char *)pGVar2,-1);
    QByteArray::operator=(this_00,in_RDI);
    QByteArray::~QByteArray((QByteArray *)0x91155a);
  }
  if (this_00 != (QByteArray *)0x0) {
    QByteArray::QByteArray(&local_50,(char *)this_00,-1);
    QByteArray::operator=(this_00,in_RDI);
    QByteArray::~QByteArray((QByteArray *)0x911594);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

GLEnvInfo::GLEnvInfo()
{
    QOpenGLContext *ctx = QOpenGLContext::currentContext();
    Q_ASSERT(ctx);
    QOpenGLFunctions *f = ctx->functions();
    const char *vendor = reinterpret_cast<const char *>(f->glGetString(GL_VENDOR));
    const char *renderer = reinterpret_cast<const char *>(f->glGetString(GL_RENDERER));
    const char *version = reinterpret_cast<const char *>(f->glGetString(GL_VERSION));
    if (vendor)
        glvendor = QByteArray(vendor);
    if (renderer)
        glrenderer = QByteArray(renderer);
    if (version)
        glversion = QByteArray(version);
}